

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O2

Instr * Peeps::RemoveDeadBlock(Instr *instr,bool *wasStmtBoundaryKeptInDeadBlock)

{
  IRKind IVar1;
  Instr *pIVar2;
  LabelInstr *pLVar3;
  Instr *this;
  byte bVar4;
  Instr *this_00;
  Instr *this_01;
  bool bVar5;
  
  pIVar2 = (Instr *)0x0;
  while (this_00 = instr, this_01 = pIVar2, this_00 != (Instr *)0x0) {
    IVar1 = this_00->m_kind;
    if ((IVar1 == InstrKindLabel) || (IVar1 == InstrKindProfiledLabel)) {
      pLVar3 = IR::Instr::AsLabelInstr(this_00);
      bVar4 = (pLVar3->field_0x78 & 2) >> 1;
      if (this_01 != (Instr *)0x0 && bVar4 == 0) {
        IR::Instr::Unlink(this_01);
        IR::Instr::InsertAfter(this_00,this_01);
      }
      goto LAB_005ade0e;
    }
    if (IVar1 == InstrKindExit) break;
    instr = this_00->m_next;
    this = this_00;
    if (((IVar1 != InstrKindPragma) || (this_00->m_opcode != StatementBoundary)) ||
       (bVar5 = this_01 != (Instr *)0x0, pIVar2 = this_00, this = this_01, this_01 = this_00, bVar5)
       ) {
      IR::Instr::Remove(this);
      pIVar2 = this_01;
    }
  }
  bVar4 = 1;
LAB_005ade0e:
  if (wasStmtBoundaryKeptInDeadBlock != (bool *)0x0) {
    *wasStmtBoundaryKeptInDeadBlock = (bool)(this_01 != (Instr *)0x0 & bVar4);
  }
  return this_00;
}

Assistant:

IR::Instr *Peeps::RemoveDeadBlock(IR::Instr *instr, bool* wasStmtBoundaryKeptInDeadBlock /* = nullptr */)
{
    IR::Instr* lastStatementBoundary = nullptr;

    while (instr && !instr->IsLabelInstr() && !instr->IsExitInstr())
    {
        IR::Instr *deadInstr = instr;
        instr = instr->m_next;

        if (deadInstr->IsPragmaInstr() && deadInstr->m_opcode == Js::OpCode::StatementBoundary)
        {
            if (lastStatementBoundary)
            {
                //Its enough if we keep latest statement boundary. Rest are dead anyway.
                lastStatementBoundary->Remove();
            }
            lastStatementBoundary = deadInstr;
        }
        else
        {
            deadInstr->Remove();
        }
    }

    // Do not let StatementBoundary to move across non-helper and helper blocks, very important under debugger:
    // if we let that happen, helper block can be moved to the end of the func so that statement maps will miss one statement.
    // Issues can be when (normally, StatementBoundary should never belong to a helper label):
    // - if we remove the label and prev label is a helper, StatementBoundary will be moved inside helper.
    // - if we move StatementBoundary under next label which is a helper, same problem again.
    bool canMoveStatementBoundaryUnderNextLabel = instr && instr->IsLabelInstr() && !instr->AsLabelInstr()->isOpHelper;

    if (lastStatementBoundary && canMoveStatementBoundaryUnderNextLabel)
    {
        lastStatementBoundary->Unlink();
        instr->InsertAfter(lastStatementBoundary);
    }

    if (wasStmtBoundaryKeptInDeadBlock)
    {
        *wasStmtBoundaryKeptInDeadBlock = lastStatementBoundary && !canMoveStatementBoundaryUnderNextLabel;
    }

    return instr;
}